

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

ElabSystemTaskSymbol *
slang::ast::ElabSystemTaskSymbol::fromSyntax(Compilation *compilation,ElabSystemTaskSyntax *syntax)

{
  Token *pTVar1;
  Token token;
  ElabSystemTaskSyntax *this;
  SourceLocation local_40;
  ElabSystemTaskSymbol *local_38;
  ElabSystemTaskSymbol *result;
  Info *local_28;
  ElabSystemTaskKind local_1c;
  ElabSystemTaskSyntax *pEStack_18;
  ElabSystemTaskKind taskKind;
  ElabSystemTaskSyntax *syntax_local;
  Compilation *compilation_local;
  
  pTVar1 = &syntax->name;
  result = *(ElabSystemTaskSymbol **)pTVar1;
  local_28 = (syntax->name).info;
  token.kind = pTVar1->kind;
  token._2_1_ = pTVar1->field_0x2;
  token.numFlags.raw = (pTVar1->numFlags).raw;
  token.rawLen = pTVar1->rawLen;
  token.info = pTVar1->info;
  pEStack_18 = syntax;
  syntax_local = (ElabSystemTaskSyntax *)compilation;
  local_1c = SemanticFacts::getElabSystemTaskKind(token);
  this = syntax_local;
  local_40 = parsing::Token::location(&pEStack_18->name);
  local_38 = BumpAllocator::
             emplace<slang::ast::ElabSystemTaskSymbol,slang::ast::ElabSystemTaskKind&,slang::SourceLocation>
                       ((BumpAllocator *)this,&local_1c,&local_40);
  Symbol::setSyntax(&local_38->super_Symbol,(SyntaxNode *)pEStack_18);
  return local_38;
}

Assistant:

ElabSystemTaskSymbol& ElabSystemTaskSymbol::fromSyntax(Compilation& compilation,
                                                       const ElabSystemTaskSyntax& syntax) {
    // Just create the symbol now. The diagnostic will be issued later
    // when someone visits the symbol and asks for it.
    auto taskKind = SemanticFacts::getElabSystemTaskKind(syntax.name);
    auto result = compilation.emplace<ElabSystemTaskSymbol>(taskKind, syntax.name.location());
    result->setSyntax(syntax);
    return *result;
}